

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest17::initTest(FunctionalTest17 *this)

{
  GLuint *pGVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  pointer pcVar7;
  float *pfVar8;
  TestError *this_00;
  size_type __dnew_4;
  string te_body;
  string tc_body;
  string gs_body;
  string vs_body;
  string fs_body;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  (*gl->patchParameteri)(0x8e72,1);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glPatchParameteri() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2413);
  (*gl->genVertexArrays)(1,&this->m_vao_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2417);
  (*gl->bindVertexArray)(this->m_vao_id);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x241a);
  fs_body._M_dataplus._M_p = (pointer)&fs_body.field_2;
  gs_body._M_dataplus._M_p = (pointer)0x1f5;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&fs_body,(ulong)&gs_body);
  _Var3 = gs_body._M_dataplus;
  fs_body.field_2._M_allocated_capacity = (size_type)gs_body._M_dataplus._M_p;
  fs_body._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nin GS_DATA\n{\n    vec4 gs_data;\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} gs;\n\nout vec4 result;\n\nsubroutine void subroutineTypeFS(out vec4 result);\n\nsubroutine(subroutineTypeFS) void subroutine1(out vec4 result)\n{\n    result = vec4(5, 6, 7, 8);\n}\n\nsubroutine uniform subroutineTypeFS function;\n\nvoid main()\n{\n    vec4 fs_data;\n\n    function(fs_data);\n    result = gs.gs_data + gs.tc_data + gs.te_data + gs.vs_data + fs_data;\n}\n"
         ,0x1f5);
  fs_body._M_string_length = (size_type)_Var3._M_p;
  pcVar7[_Var3._M_p] = '\0';
  gs_body._M_dataplus._M_p = (pointer)&gs_body.field_2;
  tc_body._M_dataplus._M_p = (pointer)0x543;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&gs_body,(ulong)&tc_body);
  _Var3 = tc_body._M_dataplus;
  gs_body.field_2._M_allocated_capacity = (size_type)tc_body._M_dataplus._M_p;
  gs_body._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nsubroutine void subroutineTypeGS(out vec4 result);\n\nsubroutine(subroutineTypeGS) void subroutine1(out vec4 result)\n{\n    result = vec4(4, 5, 6, 7);\n}\n\nsubroutine uniform subroutineTypeGS function;\n\nin TE_DATA\n{\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} te[];\n\nout GS_DATA\n{\n    vec4 gs_data;\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} result;\n\nvoid main()\n{\n    function(result.gs_data);\n    gl_Position    = vec4(1, -1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n\n    function(result.gs_data);\n    gl_Position    = vec4(-1, -1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n\n    function(result.gs_data);\n    gl_Position    = vec4(1, 1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n\n    function(result.gs_data);\n    gl_Position    = vec4(-1, 1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n    EndPrimitive();\n}\n"
         ,0x543);
  gs_body._M_string_length = (size_type)_Var3._M_p;
  pcVar7[_Var3._M_p] = '\0';
  te_body._M_dataplus._M_p = (pointer)0x2c9;
  tc_body._M_dataplus._M_p = (pointer)&tc_body.field_2;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&tc_body,(ulong)&te_body);
  _Var3 = te_body._M_dataplus;
  tc_body.field_2._M_allocated_capacity = (size_type)te_body._M_dataplus._M_p;
  tc_body._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (vertices = 4) out;\n\nsubroutine void subroutineTypeTC(out vec4 result);\n\nsubroutine(subroutineTypeTC) void subroutine1(out vec4 result)\n{\n    result = vec4(2, 3, 4, 5);\n}\n\nsubroutine uniform subroutineTypeTC function;\n\nin VS_DATA\n{\n    vec4 vs_data;\n} vs[];\n\nout TC_DATA\n{\n    vec4 tc_data;\n    vec4 vs_data;\n} result[];\n\nvoid main()\n{\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n\n    function(result[gl_InvocationID].tc_data);\n    result[gl_InvocationID].vs_data = vs[gl_InvocationID].vs_data;\n}\n"
         ,0x2c9);
  tc_body._M_string_length = (size_type)_Var3._M_p;
  pcVar7[_Var3._M_p] = '\0';
  vs_body._M_dataplus._M_p = (pointer)0x222;
  te_body._M_dataplus._M_p = (pointer)&te_body.field_2;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&te_body,(ulong)&vs_body);
  _Var3 = vs_body._M_dataplus;
  te_body.field_2._M_allocated_capacity = (size_type)vs_body._M_dataplus._M_p;
  te_body._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (quads, point_mode) in;\n\nsubroutine void subroutineTypeTE(out vec4 result);\n\nsubroutine(subroutineTypeTE) void subroutine1(out vec4 result)\n{\n    result = vec4(3, 4, 5, 6);\n}\n\nsubroutine uniform subroutineTypeTE function;\n\nin TC_DATA\n{\n    vec4 tc_data;\n    vec4 vs_data;\n} tc[];\n\nout TE_DATA\n{\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} result;\n\nvoid main()\n{\n    result.vs_data = tc[0].vs_data;\n    result.tc_data = tc[0].tc_data;\n    function(result.te_data);\n}\n"
         ,0x222);
  te_body._M_string_length = (size_type)_Var3._M_p;
  pcVar7[_Var3._M_p] = '\0';
  __dnew_4 = 0x15c;
  vs_body._M_dataplus._M_p = (pointer)&vs_body.field_2;
  pcVar7 = (pointer)std::__cxx11::string::_M_create((ulong *)&vs_body,(ulong)&__dnew_4);
  sVar2 = __dnew_4;
  vs_body.field_2._M_allocated_capacity = __dnew_4;
  vs_body._M_dataplus._M_p = pcVar7;
  memcpy(pcVar7,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nout VS_DATA\n{\n    vec4 vs_data;\n} result;\n\nsubroutine void subroutineTypeVS(out vec4 result);\n\nsubroutine(subroutineTypeVS) void subroutine1(out vec4 result)\n{\n    result = vec4(1, 2, 3, 4);\n}\n\nsubroutine uniform subroutineTypeVS function;\n\nvoid main()\n{\n    function(result.vs_data);\n}\n"
         ,0x15c);
  vs_body._M_string_length = sVar2;
  pcVar7[sVar2] = '\0';
  __dnew_4 = __dnew_4 & 0xffffffff00000000;
  bVar4 = Utils::buildProgram(gl,&vs_body,&tc_body,&te_body,&gs_body,&fs_body,(GLchar **)0x0,
                              (uint *)&__dnew_4,&this->m_vs_id,&this->m_tc_id,&this->m_te_id,
                              &this->m_gs_id,&this->m_fs_id,&this->m_po_id);
  if (bVar4) {
    pGVar1 = &this->m_to_id;
    (*gl->genTextures)(1,pGVar1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glGenTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x242c);
    (*gl->bindTexture)(0xde1,*pGVar1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x242f);
    (*gl->texStorage2D)(0xde1,1,0x8814,this->m_to_width,this->m_to_height);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2433);
    (*gl->genFramebuffers)(1,&this->m_fbo_id);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glGenFramebuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2437);
    (*gl->bindFramebuffer)(0x8d40,this->m_fbo_id);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glBindFramebuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x243a);
    (*gl->framebufferTexture2D)(0x8ca9,0x8ce0,0xde1,*pGVar1,0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x243d);
    (*gl->pixelStorei)(0xd05,1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glPixelStorei() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2441);
    pfVar8 = (float *)operator_new__((ulong)(this->m_to_width * this->m_to_height * 4) << 2);
    this->m_to_data = pfVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vs_body._M_dataplus._M_p != &vs_body.field_2) {
      operator_delete(vs_body._M_dataplus._M_p,vs_body.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)te_body._M_dataplus._M_p != &te_body.field_2) {
      operator_delete(te_body._M_dataplus._M_p,te_body.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tc_body._M_dataplus._M_p != &tc_body.field_2) {
      operator_delete(tc_body._M_dataplus._M_p,tc_body.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gs_body._M_dataplus._M_p != &gs_body.field_2) {
      operator_delete(gs_body._M_dataplus._M_p,gs_body.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fs_body._M_dataplus._M_p != &fs_body.field_2) {
      operator_delete(fs_body._M_dataplus._M_p,fs_body.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to link test program object",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x2427);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FunctionalTest17::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Configure GL_PATCH_VERTICES so that TC only takes a single patch vertex */
	gl.patchParameteri(GL_PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteri() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up test program object */
	std::string fs_body = getFragmentShaderBody();
	std::string gs_body = getGeometryShaderBody();
	std::string tc_body = getTessellationControlShaderBody();
	std::string te_body = getTessellationEvaluationShaderBody();
	std::string vs_body = getVertexShaderBody();

	if (!Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, DE_NULL, /* xfb_varyings */
							 DE_NULL,												   /* n_xfb_varyings */
							 &m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		TCU_FAIL("Failed to link test program object");
	}

	/* Set up a texture object that will be used as a color attachment */
	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
					GL_RGBA32F, m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Set up FBO */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Make sure glReadPixels() does not return misaligned data */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* Initialize a buffer that will be used to store rendered data */
	m_to_data = new float[m_to_width * m_to_height * 4 /* rgba */];
}